

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGeneric<double,double,double,duckdb::BinaryStandardOperatorWrapper,duckdb::LogBaseOperator,bool>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  double *rdata_00;
  ValidityMask *result_data_00;
  UnifiedVectorFormat *in_RCX;
  VectorType in_DL;
  ulong in_RSI;
  ulong in_RDI;
  byte in_R8B;
  double *result_data;
  UnifiedVectorFormat rdata;
  UnifiedVectorFormat ldata;
  SelectionVector *lsel;
  SelectionVector *rsel;
  double *ldata_00;
  ValidityMask *in_stack_ffffffffffffff30;
  ValidityMask *in_stack_ffffffffffffff38;
  ValidityMask *rvalidity;
  ValidityMask *in_stack_ffffffffffffff40;
  SelectionVector local_b8 [2];
  UnifiedVectorFormat local_80 [16];
  SelectionVector local_70 [2];
  byte local_31;
  UnifiedVectorFormat *local_30;
  VectorType local_28;
  ulong local_20;
  ulong local_18;
  
  local_31 = in_R8B & 1;
  local_30 = in_RCX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_28 = in_DL;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_80);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&stack0xffffffffffffff38);
  duckdb::Vector::ToUnifiedFormat(local_18,local_30);
  duckdb::Vector::ToUnifiedFormat(local_20,local_30);
  duckdb::Vector::SetVectorType(local_28);
  rdata_00 = FlatVector::GetData<double>((Vector *)0xe1007d);
  ldata_00 = rdata_00;
  UnifiedVectorFormat::GetData<double>(local_80);
  UnifiedVectorFormat::GetData<double>((UnifiedVectorFormat *)&stack0xffffffffffffff38);
  rsel = local_70;
  lsel = local_b8;
  rvalidity = in_stack_ffffffffffffff38;
  result_data_00 = FlatVector::Validity((Vector *)0xe1010a);
  ExecuteGenericLoop<double,double,double,duckdb::BinaryStandardOperatorWrapper,duckdb::LogBaseOperator,bool>
            (ldata_00,rdata_00,(double *)result_data_00,lsel,rsel,(idx_t)local_30,
             in_stack_ffffffffffffff30,rvalidity,in_stack_ffffffffffffff40,
             SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)lsel);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)lsel);
  return;
}

Assistant:

static void ExecuteGeneric(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		ExecuteGenericLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata),
		    result_data, ldata.sel, rdata.sel, count, ldata.validity, rdata.validity, FlatVector::Validity(result),
		    fun);
	}